

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dstar.cpp
# Opt level: O3

void __thiscall DSDcc::DSDDstar::processSlowData(DSDDstar *this,bool firstFrame)

{
  byte bVar1;
  int iVar2;
  DStarSlowDataType DVar3;
  undefined7 in_register_00000031;
  
  if (((int)CONCAT71(in_register_00000031,firstFrame) == 0) &&
     (iVar2 = (this->m_slowData).counter, iVar2 != 0)) {
    if (0 < iVar2) {
      processSlowDataByte(this,this->slowdata[0]);
      (this->m_slowData).counter = (this->m_slowData).counter + -1;
    }
  }
  else {
    bVar1 = this->slowdata[0];
    (this->m_slowData).counter = bVar1 & 0xf;
    if (bVar1 < 0x70) {
      DVar3 = (DStarSlowDataType)(bVar1 >> 4);
      if (DVar3 == DStarSlowDataText) {
        (this->m_slowData).textFrameIndex = bVar1 & 3;
        (this->m_slowData).counter = 5;
        (this->m_slowData).currentDataType = DStarSlowDataText;
        DVar3 = DStarSlowDataText;
      }
      else if (DVar3 == DStarSlowDataFiller) {
        (this->m_slowData).currentDataType = DStarSlowDataFiller;
        (this->m_slowData).counter = 2;
        DVar3 = DStarSlowDataFiller;
      }
      else {
        (this->m_slowData).currentDataType = DVar3;
      }
    }
    else {
      (this->m_slowData).currentDataType = DStarSlowDataNone;
      DVar3 = DStarSlowDataNone;
    }
    if (firstFrame) {
      (this->m_slowData).radioHeaderIndex = 0;
      if (DVar3 == DStarSlowDataGPS) {
        if ((this->m_slowData).gpsStart == true) {
          (this->m_slowData).gpsIndex = 0;
          (this->m_slowData).gpsStart = false;
        }
      }
      else if ((DVar3 == DStarSlowDataText) || (DVar3 == DStarSlowDataHeader)) {
        if ((this->m_slowData).gpsStart == false) {
          processDPRS(this);
        }
        (this->m_slowData).gpsStart = true;
      }
    }
  }
  if (0 < (this->m_slowData).counter) {
    processSlowDataByte(this,this->slowdata[1]);
    iVar2 = (this->m_slowData).counter;
    (this->m_slowData).counter = iVar2 + -1;
    if (1 < iVar2) {
      processSlowDataByte(this,this->slowdata[2]);
      (this->m_slowData).counter = (this->m_slowData).counter + -1;
    }
  }
  processSlowDataGroup(this);
  return;
}

Assistant:

void DSDDstar::processSlowData(bool firstFrame)
{
    // byte 0
    if (firstFrame || (m_slowData.counter == 0))
    {
        int dataType = (slowdata[0] >> 4) & 0xF;
        m_slowData.counter = slowdata[0] & 0xF;

        if (dataType > 6)
        {
            m_slowData.currentDataType = DStarSlowDataNone;
        }
        else if (dataType == 6) // filler
        {
            m_slowData.currentDataType = DStarSlowDataFiller;
            m_slowData.counter = 2;
        }
        else if (dataType == 4) // text
        {
            m_slowData.textFrameIndex = m_slowData.counter % 4;
            m_slowData.counter = 5;
            m_slowData.currentDataType = (DStarSlowDataType) dataType;
        }
        else
        {
            m_slowData.currentDataType = (DStarSlowDataType) dataType;
        }

        if (firstFrame)
        {
            // unconditionally reset counters for elements that are always contained in the same 20 frame sequence
            m_slowData.radioHeaderIndex = 0;

            // initializations based on data type
            switch (m_slowData.currentDataType)
            {
            case DStarSlowDataHeader:
                if (!m_slowData.gpsStart)
                {
                    processDPRS();
                }
                m_slowData.gpsStart = true;
                break;
            case DStarSlowDataText:
                if (!m_slowData.gpsStart)
                {
                    processDPRS();
                }
                m_slowData.gpsStart = true;
                break;
            case DStarSlowDataGPS:
                if (m_slowData.gpsStart)
                {
                    m_slowData.gpsIndex = 0;
                    m_slowData.gpsStart = false;
                }
                break;
            default:
                break;
            }
        }

//        std::cerr << "DSDDstar::processSlowData: " << dataType << ":" << m_slowData.counter << std::endl;
    }
    else
    {
        if (m_slowData.counter > 0)
        {
            processSlowDataByte(slowdata[0]);
            m_slowData.counter--;
        }
    }
    // byte 1
    if (m_slowData.counter > 0)
    {
        processSlowDataByte(slowdata[1]);
        m_slowData.counter--;
    }
    // byte 2
    if (m_slowData.counter > 0)
    {
        processSlowDataByte(slowdata[2]);
        m_slowData.counter--;
    }

    processSlowDataGroup();
}